

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

ExpEmit __thiscall FxShift::Emit(FxShift *this,VMFunctionBuilder *build)

{
  byte bVar1;
  FxExpression *pFVar2;
  long lVar3;
  uint uVar4;
  int iVar5;
  ExpEmit EVar6;
  uint extraout_var_00;
  ulong uVar7;
  undefined4 opc;
  ExpEmit EVar8;
  ExpVal local_48;
  ExpEmit local_38;
  uint extraout_var;
  
  pFVar2 = (this->super_FxBinary).left;
  if (pFVar2->ValueType->RegType != '\0') {
    __assert_fail("left->ValueType->GetRegType() == REGT_INT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                  ,0xeb9,"virtual ExpEmit FxShift::Emit(VMFunctionBuilder *)");
  }
  if (((this->super_FxBinary).right)->ValueType->RegType != '\0') {
    __assert_fail("right->ValueType->GetRegType() == REGT_INT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                  ,0xeba,"virtual ExpEmit FxShift::Emit(VMFunctionBuilder *)");
  }
  uVar4 = (this->super_FxBinary).Operator - 0x116;
  if (2 < uVar4) {
    __assert_fail("index >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                  ,0xec7,"virtual ExpEmit FxShift::Emit(VMFunctionBuilder *)");
  }
  lVar3 = *(long *)(&DAT_005f3628 + (ulong)uVar4 * 8);
  EVar6._0_4_ = (*pFVar2->_vptr_FxExpression[9])();
  EVar6.Konst = (bool)(char)extraout_var;
  EVar6.Fixed = (bool)(char)(extraout_var >> 8);
  EVar6.Final = (bool)(char)(extraout_var >> 0x10);
  EVar6.Target = (bool)(char)(extraout_var >> 0x18);
  local_38 = EVar6;
  iVar5 = (*((this->super_FxBinary).right)->_vptr_FxExpression[3])();
  if ((char)iVar5 == '\0') {
    pFVar2 = (this->super_FxBinary).right;
    uVar4 = (*pFVar2->_vptr_FxExpression[9])(pFVar2,build);
    local_48.Type = (PType *)CONCAT44(extraout_var_00,uVar4);
    if ((extraout_var_00 & 1) != 0) {
      __assert_fail("!op2.Konst",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                    ,0xed3,"virtual ExpEmit FxShift::Emit(VMFunctionBuilder *)");
    }
    ExpEmit::Free((ExpEmit *)&local_48,build);
    opc = uVar4 & 0xffff;
    uVar4 = extraout_var_00;
    if ((extraout_var & 1) != 0) {
      if ((extraout_var_00 & 1) != 0) goto LAB_0050e7ac;
      uVar7 = 1;
      goto LAB_0050e6d1;
    }
  }
  else {
    ExpVal::ExpVal(&local_48,(ExpVal *)((this->super_FxBinary).right + 1));
    if ((local_48.Type)->RegType == '\x01') {
      opc = (undefined4)(double)CONCAT44(local_48.field_1._4_4_,local_48.field_1.Int);
    }
    else {
      opc = 0;
      if ((local_48.Type)->RegType == '\0') {
        opc = local_48.field_1.Int;
      }
    }
    ExpVal::~ExpVal(&local_48);
    uVar4 = 1;
    if ((extraout_var & 1) != 0) {
LAB_0050e7ac:
      __assert_fail("!op2.Konst",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                    ,0xedf,"virtual ExpEmit FxShift::Emit(VMFunctionBuilder *)");
    }
  }
  ExpEmit::Free(&local_38,build);
  uVar7 = (ulong)((uVar4 & 1) * 2);
LAB_0050e6d1:
  bVar1 = Emit::InstrMap[lVar3][uVar7];
  if (bVar1 != 0) {
    uVar4 = VMFunctionBuilder::RegAvailability::Get(build->Registers,1);
    VMFunctionBuilder::Emit(build,(uint)bVar1,uVar4 & 0xffff,EVar6._0_4_ & 0xffff,opc);
    EVar8._0_4_ = uVar4 & 0xffff | 0x1000000;
    EVar8.Konst = false;
    EVar8.Fixed = false;
    EVar8.Final = false;
    EVar8.Target = false;
    return EVar8;
  }
  __assert_fail("instr != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                ,0xee2,"virtual ExpEmit FxShift::Emit(VMFunctionBuilder *)");
}

Assistant:

ExpEmit FxShift::Emit(VMFunctionBuilder *build)
{
	assert(left->ValueType->GetRegType() == REGT_INT);
	assert(right->ValueType->GetRegType() == REGT_INT);
	static const VM_UBYTE InstrMap[][4] =
	{
		{ OP_SLL_RR, OP_SLL_KR, OP_SLL_RI },	// TK_LShift
		{ OP_SRA_RR, OP_SRA_KR, OP_SRA_RI },	// TK_RShift
		{ OP_SRL_RR, OP_SRL_KR, OP_SRL_RI },	// TK_URShift
	};
	int index, instr, rop;
	ExpEmit op1, op2;

	index = Operator == TK_LShift ? 0 :
			Operator == TK_RShift ? 1 :
			Operator == TK_URShift ? 2 : -1;
	assert(index >= 0);
	op1 = left->Emit(build);

	// Shift instructions use right-hand immediates instead of constant registers.
	if (right->isConstant())
	{
		rop = static_cast<FxConstant *>(right)->GetValue().GetInt();
		op2.Konst = true;
	}
	else
	{
		op2 = right->Emit(build);
		assert(!op2.Konst);
		op2.Free(build);
		rop = op2.RegNum;
	}

	if (!op1.Konst)
	{
		op1.Free(build);
		instr = InstrMap[index][op2.Konst? 2:0];
	}
	else
	{
		assert(!op2.Konst);
		instr = InstrMap[index][1];
	}
	assert(instr != 0);
	ExpEmit to(build, REGT_INT);
	build->Emit(instr, to.RegNum, op1.RegNum, rop);
	return to;
}